

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O1

void smf_delete(smf_t *smf)

{
  GPtrArray *pGVar1;
  
  pGVar1 = smf->tracks_array;
  while (pGVar1->len != 0) {
    smf_track_delete((smf_track_t *)pGVar1->pdata[pGVar1->len - 1]);
    pGVar1 = smf->tracks_array;
  }
  smf_fini_tempo(smf);
  if (smf->tracks_array->len == 0) {
    if (smf->number_of_tracks == 0) {
      g_ptr_array_free(smf->tracks_array,1);
      g_ptr_array_free(smf->tempo_array,1);
      smf->format = 0;
      smf->ppqn = 0;
      smf->frames_per_second = 0;
      smf->resolution = 0;
      *(undefined8 *)&smf->number_of_tracks = 0;
      smf->stream = (FILE *)0x0;
      smf->file_buffer = (void *)0x0;
      smf->file_buffer_length = 0;
      smf->next_chunk_offset = 0;
      *(undefined8 *)&smf->expected_number_of_tracks = 0;
      smf->tracks_array = (GPtrArray *)0x0;
      smf->last_seek_position = 0.0;
      smf->tempo_array = (GPtrArray *)0x0;
      free(smf);
      return;
    }
    __assert_fail("smf->number_of_tracks == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,0x5c,"void smf_delete(smf_t *)");
  }
  __assert_fail("smf->tracks_array->len == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                ,0x5b,"void smf_delete(smf_t *)");
}

Assistant:

void
smf_delete(smf_t *smf)
{
	/* Remove all the tracks, from last to first. */
	while (smf->tracks_array->len > 0)
		smf_track_delete(g_ptr_array_index(smf->tracks_array, smf->tracks_array->len - 1));

	smf_fini_tempo(smf);

	assert(smf->tracks_array->len == 0);
	assert(smf->number_of_tracks == 0);
	g_ptr_array_free(smf->tracks_array, TRUE);
	g_ptr_array_free(smf->tempo_array, TRUE);

	memset(smf, 0, sizeof(smf_t));
	free(smf);
}